

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O1

void UI::gather_slice_arg(int *argc,char **argv)

{
  int iVar1;
  bool bVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_113;
  allocator<char> local_112;
  allocator<char> local_111;
  char *local_110;
  int local_104;
  long local_100;
  long local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,argv[4],(allocator<char> *)&local_110);
  bVar4 = isinteger(&local_138);
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,argv[5],&local_111);
    bVar5 = isinteger(&local_70);
    if (!bVar5) goto LAB_0010bad4;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,argv[6],&local_112);
    bVar5 = isinteger(&local_90);
    if (!bVar5) {
      bVar5 = true;
      goto LAB_0010bad7;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,argv[7],&local_113);
    bVar6 = isinteger(&local_50);
    bVar5 = true;
    bVar2 = true;
  }
  else {
LAB_0010bad4:
    bVar5 = false;
LAB_0010bad7:
    bVar2 = false;
    bVar6 = false;
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (bVar6 == false) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"Invalid co-ordinates detected. Aborting.","");
    print_ln(&local_f0);
    local_b0._M_dataplus._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
      return;
    }
LAB_0010be63:
    operator_delete(local_b0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,argv[4],&local_139);
  _Var3._M_p = local_138._M_dataplus._M_p;
  piVar7 = __errno_location();
  iVar1 = *piVar7;
  *piVar7 = 0;
  lVar8 = strtol(_Var3._M_p,&local_110,10);
  if (local_110 == _Var3._M_p) {
    std::__throw_invalid_argument("stoi");
LAB_0010be91:
    std::__throw_out_of_range("stoi");
LAB_0010be9d:
    std::__throw_invalid_argument("stoi");
LAB_0010bea9:
    std::__throw_out_of_range("stoi");
LAB_0010beb5:
    std::__throw_invalid_argument("stoi");
LAB_0010bec1:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar8 != lVar8) || (*piVar7 == 0x22)) goto LAB_0010be91;
    if (*piVar7 == 0) {
      *piVar7 = iVar1;
    }
    local_f8 = lVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,argv[5],&local_139);
    _Var3._M_p = local_138._M_dataplus._M_p;
    iVar1 = *piVar7;
    *piVar7 = 0;
    lVar8 = strtol(local_138._M_dataplus._M_p,&local_110,10);
    if (local_110 == _Var3._M_p) goto LAB_0010be9d;
    if ((lVar8 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_0010bea9;
    if (*piVar7 == 0) {
      *piVar7 = iVar1;
    }
    local_100 = lVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,argv[6],&local_139);
    _Var3._M_p = local_138._M_dataplus._M_p;
    iVar1 = *piVar7;
    *piVar7 = 0;
    lVar8 = strtol(local_138._M_dataplus._M_p,&local_110,10);
    if (local_110 == _Var3._M_p) goto LAB_0010beb5;
    if ((lVar8 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_0010bec1;
    if (*piVar7 == 0) {
      *piVar7 = iVar1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,argv[7],&local_139);
    _Var3._M_p = local_138._M_dataplus._M_p;
    local_104 = *piVar7;
    *piVar7 = 0;
    lVar9 = strtol(local_138._M_dataplus._M_p,&local_110,10);
    if (local_110 != _Var3._M_p) {
      if ((0xfffffffeffffffff < lVar9 - 0x80000000U) && (*piVar7 != 0x22)) {
        if (*piVar7 == 0) {
          *piVar7 = local_104;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,argv[2],(allocator<char> *)&local_138);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,argv[3],(allocator<char> *)&local_110);
        execute_slice(&local_b0,&local_d0,(int)local_f8,(int)local_100,(int)lVar8,(int)lVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        local_f0.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
          return;
        }
        goto LAB_0010be63;
      }
      goto LAB_0010bed9;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0010bed9:
  uVar10 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar10);
}

Assistant:

void UI::gather_slice_arg(int &argc, char *argv[])
{
    if( (isinteger(argv[4]))
     && (isinteger(argv[5]))
     && (isinteger(argv[6]))
     && (isinteger(argv[7])) )
    {
        int x1 = std::stoi(argv[4]);
        int y1 = std::stoi(argv[5]);
        int x2 = std::stoi(argv[6]);
        int y2 = std::stoi(argv[7]);
        execute_slice(argv[2],argv[3],x1,y1,x2,y2);
    }
    else
    {
        print_ln("Invalid co-ordinates detected. Aborting.");
    }
}